

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O2

void __thiscall
CChromeTracer::addCallLogging
          (CChromeTracer *this,char *name,uint64_t threadId,uint64_t startTime,uint64_t delta)

{
  pointer pRVar1;
  char *local_38;
  RecordType local_2c;
  
  local_38 = name;
  std::mutex::lock(&this->m_Mutex);
  if (this->m_BufferSize == 0) {
    writeCallLogging(this,name,threadId,startTime,delta);
  }
  else {
    local_2c = CallLogging;
    std::vector<CChromeTracer::Record,std::allocator<CChromeTracer::Record>>::
    emplace_back<CChromeTracer::RecordType,char_const*&>
              ((vector<CChromeTracer::Record,std::allocator<CChromeTracer::Record>> *)
               &this->m_RecordBuffer,&local_2c,&local_38);
    pRVar1 = (this->m_RecordBuffer).
             super__Vector_base<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pRVar1[-1].field_3.CallLogging.ThreadId = threadId;
    pRVar1[-1].field_3.CallLogging.StartTime = startTime;
    pRVar1[-1].field_3.CallLogging.Delta = delta;
    checkFlushRecords(this);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void addCallLogging(
            const char* name,
            uint64_t threadId,
            uint64_t startTime,
            uint64_t delta )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        if( m_BufferSize == 0 )
        {
            writeCallLogging(
                name,
                threadId,
                startTime,
                delta );
        }
        else
        {
            m_RecordBuffer.emplace_back(RecordType::CallLogging, name);

            Record& rec = m_RecordBuffer.back();
            rec.CallLogging.ThreadId = threadId;
            rec.CallLogging.StartTime = startTime;
            rec.CallLogging.Delta = delta;

            checkFlushRecords();
        }
    }